

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.H
# Opt level: O2

void Fl_Text_Display::v_scrollbar_cb(Fl_Scrollbar *b,Fl_Text_Display *textD)

{
  int topLineNum;
  
  topLineNum = (int)(b->super_Fl_Slider).super_Fl_Valuator.value_;
  if (textD->mTopLineNum == topLineNum) {
    return;
  }
  scroll(textD,topLineNum,textD->mHorizOffset);
  return;
}

Assistant:

int value() const {return int(Fl_Slider::value());}